

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall
ICM::Compiler::InstructionCreater::createNodePrintIdent
          (InstructionCreater *this,Node *node,Element *refelt)

{
  bool bVar1;
  PrintIdent *pPVar2;
  iterator b;
  Node *node_00;
  vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_> *this_00;
  size_t id;
  Element EVar3;
  anon_union_4_2_4727c1b0_for_Element_0 local_90 [2];
  uint_t local_88;
  Element *local_80;
  Element *e;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  __end2;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  __begin2;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_60;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_58;
  RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  local_50;
  RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  *local_40;
  RangeIterator<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  *__range2;
  PrintIdent *local_28;
  PrintIdent *inst;
  Element *refelt_local;
  Node *node_local;
  InstructionCreater *this_local;
  
  inst = (PrintIdent *)refelt;
  refelt_local = (Element *)node;
  node_local = (Node *)this;
  pPVar2 = (PrintIdent *)operator_new(0x28);
  (pPVar2->Args).
  super__Vector_base<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar2->Args).
  super__Vector_base<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar2->super_InstDataBase<(ICM::Instruction::Instruction)6>).super_InstructionData.
  _vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar2->super_InstDataBase<(ICM::Instruction::Instruction)6>).super_InstructionData.Inst = 0;
  (pPVar2->Args).
  super__Vector_base<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Instruction::Insts::PrintIdent::PrintIdent(pPVar2);
  local_28 = pPVar2;
  local_60._M_current =
       (Element *)
       std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::begin
                 ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)
                  refelt_local);
  local_58 = __gnu_cxx::
             __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
             ::operator+(&local_60,1);
  b = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::end
                ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)
                 refelt_local);
  local_50 = (RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
              )Common::
               rangei<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element*,std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>>
                         (local_58,(__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                                    )b._M_current);
  local_40 = &local_50;
  __end2 = Common::
           RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
           ::begin(local_40);
  e = (Element *)
      Common::
      RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
      ::end(local_40);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                                     *)&e), bVar1) {
    local_80 = __gnu_cxx::
               __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
               ::operator*(&__end2);
    bVar1 = ASTBase::Element::isRefer(local_80);
    if (bVar1) {
      node_00 = AnalysisBase::GetRefer(&this->super_AnalysisBase,local_80);
      createNode(this,node_00,local_80);
    }
    this_00 = &local_28->Args;
    EVar3 = Instruction::ConvertToInstElement(local_80);
    local_88 = EVar3.index;
    local_90[0] = EVar3.field_0;
    std::vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>::push_back
              (this_00,(value_type *)&local_90[0].field_0);
    __gnu_cxx::
    __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
    ::operator++(&__end2);
  }
  Instruction::InstructionList::push(&this->InstList,(InstructionData *)local_28);
  pPVar2 = inst;
  id = CurrInstID(this);
  ASTBase::Element::setRefer((Element *)pPVar2,id);
  return true;
}

Assistant:

bool createNodePrintIdent(Node &node, Element &refelt) {
				Insts::PrintIdent *inst = new Insts::PrintIdent();
				for (auto &e : rangei(node.begin() + 1, node.end())) {
					if (e.isRefer())
						createNode(GetRefer(e), e);
					inst->Args.push_back(ConvertToInstElement(e));
				}
				InstList.push(inst);
				refelt.setRefer(CurrInstID());
				return true;
			}